

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::LoopInvariantCodeMotionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopInvariantCodeMotionCase *this,bool optimized)

{
  size_type *psVar1;
  CaseShaderType CVar2;
  char *pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  int iVar7;
  ulong *puVar8;
  long *plVar9;
  ulong uVar10;
  string statements;
  long *local_350;
  undefined8 local_348;
  long local_340;
  undefined8 uStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  float local_30c;
  long *local_308;
  undefined8 local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  undefined8 local_2c0;
  ulong local_2b8;
  undefined8 uStack_2b0;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298;
  long lStack_290;
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_30c = 0.0;
  if (0 < this->m_numLoopIterations) {
    iVar7 = 0;
    do {
      local_30c = local_30c + (float)iVar7 * 3.2 + 4.6;
      iVar7 = iVar7 + 1;
    } while (this->m_numLoopIterations != iVar7);
  }
  CVar2 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  if (CVar2 == CASESHADERTYPE_FRAGMENT) {
    pcVar3 = local_248.field_2._M_local_buf + 7;
    local_248.field_2._M_local_buf[4] = 'u';
    local_248.field_2._M_allocated_capacity._5_2_ = 0x706d;
    local_248.field_2._M_allocated_capacity._0_4_ = 0x6964656d;
    local_248._M_string_length = 7;
  }
  else {
    if (CVar2 != CASESHADERTYPE_VERTEX) {
      uVar6 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      if ((optimized) && (local_350 != &local_340)) {
        operator_delete(local_350,local_340 + 1);
      }
      if ((optimized) && (local_288 != local_278)) {
        operator_delete(local_288,local_278[0] + 1);
      }
      if ((optimized) && (local_330 != &local_320)) {
        operator_delete(local_330,local_320 + 1);
      }
      if ((optimized) && (local_208 != &local_1f8)) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if ((optimized) && (local_228 != &local_218)) {
        operator_delete(local_228,local_218 + 1);
      }
      if ((optimized) && (local_308 != &local_2f8)) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if ((optimized) && (local_268 != local_258)) {
        operator_delete(local_268,local_258[0] + 1);
      }
      if ((optimized) && (local_2a8 != &local_298)) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if ((optimized) && (local_2c8 != &local_2b8)) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if ((optimized) && (local_2e8 != &local_2d8)) {
        operator_delete(local_2e8,local_2d8 + 1);
      }
      if ((optimized) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT17(local_248.field_2._M_local_buf[7],
                                 CONCAT25(local_248.field_2._M_allocated_capacity._5_2_,
                                          CONCAT14(local_248.field_2._M_local_buf[4],
                                                   local_248.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      _Unwind_Resume(uVar6);
    }
    pcVar3 = local_248.field_2._M_local_buf + 5;
    local_248.field_2._M_local_buf[4] = 'p';
    local_248.field_2._M_allocated_capacity._0_4_ = 0x68676968;
    local_248._M_string_length = 5;
  }
  local_30c = 1.0 / local_30c;
  *pcVar3 = '\0';
  if (optimized) {
    std::operator+(&local_1c8,"\t",&local_248);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_2e8 = &local_2d8;
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_2d8 = *puVar8;
      lStack_2d0 = plVar4[3];
    }
    else {
      local_2d8 = *puVar8;
      local_2e8 = (ulong *)*plVar4;
    }
    local_2e0 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_248._M_dataplus._M_p);
    local_2c8 = &local_2b8;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_2b8 = *puVar8;
      uStack_2b0 = puVar5[3];
    }
    else {
      local_2b8 = *puVar8;
      local_2c8 = (ulong *)*puVar5;
    }
    local_2c0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_298 = *puVar8;
      lStack_290 = plVar4[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *puVar8;
      local_2a8 = (ulong *)*plVar4;
    }
    local_2a0 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,this->m_numLoopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar10 = 0xf;
    if (local_2a8 != &local_298) {
      uVar10 = local_298;
    }
    if (uVar10 < (ulong)(local_260 + local_2a0)) {
      uVar10 = 0xf;
      if (local_268 != local_258) {
        uVar10 = local_258[0];
      }
      if (uVar10 < (ulong)(local_260 + local_2a0)) goto LAB_0103816d;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2a8);
    }
    else {
LAB_0103816d:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_268);
    }
    local_308 = &local_2f8;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_2f8 = *plVar4;
      uStack_2f0 = puVar5[3];
    }
    else {
      local_2f8 = *plVar4;
      local_308 = (long *)*puVar5;
    }
    local_300 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_308);
    local_228 = &local_218;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_218 = *plVar4;
      lStack_210 = puVar5[3];
    }
    else {
      local_218 = *plVar4;
      local_228 = (long *)*puVar5;
    }
    local_220 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_248._M_dataplus._M_p);
    local_208 = &local_1f8;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_1f8 = *plVar4;
      lStack_1f0 = puVar5[3];
    }
    else {
      local_1f8 = *plVar4;
      local_208 = (long *)*puVar5;
    }
    local_200 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_320 = *puVar8;
      lStack_318 = puVar5[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar8;
      local_330 = (ulong *)*puVar5;
    }
    local_328 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>((double)local_30c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar10 = 0xf;
    if (local_330 != &local_320) {
      uVar10 = local_320;
    }
    if (uVar10 < (ulong)(local_280 + local_328)) {
      uVar10 = 0xf;
      if (local_288 != local_278) {
        uVar10 = local_278[0];
      }
      if (uVar10 < (ulong)(local_280 + local_328)) goto LAB_010386b1;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_010386b1:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_288);
    }
    local_350 = &local_340;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_340 = *plVar4;
      uStack_338 = puVar5[3];
    }
    else {
      local_340 = *plVar4;
      local_350 = (long *)*puVar5;
    }
    local_348 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
  }
  else {
    std::operator+(&local_1c8,"\t",&local_248);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_2d8 = *puVar8;
      lStack_2d0 = puVar5[3];
      local_2e8 = &local_2d8;
    }
    else {
      local_2d8 = *puVar8;
      local_2e8 = (ulong *)*puVar5;
    }
    local_2e0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,this->m_numLoopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar10 = 0xf;
    if (local_2e8 != &local_2d8) {
      uVar10 = local_2d8;
    }
    if (uVar10 < (ulong)(local_260 + local_2e0)) {
      uVar10 = 0xf;
      if (local_268 != local_258) {
        uVar10 = local_258[0];
      }
      if (uVar10 < (ulong)(local_260 + local_2e0)) goto LAB_01038023;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2e8);
    }
    else {
LAB_01038023:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_268);
    }
    local_2c8 = &local_2b8;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_2b8 = *puVar8;
      uStack_2b0 = puVar5[3];
    }
    else {
      local_2b8 = *puVar8;
      local_2c8 = (ulong *)*puVar5;
    }
    local_2c0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_298 = *puVar8;
      lStack_290 = puVar5[3];
    }
    else {
      local_298 = *puVar8;
      local_2a8 = (ulong *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_248._M_dataplus._M_p);
    local_308 = &local_2f8;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_2f8 = *plVar4;
      uStack_2f0 = puVar5[3];
    }
    else {
      local_2f8 = *plVar4;
      local_308 = (long *)*puVar5;
    }
    local_300 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
    local_228 = &local_218;
    plVar9 = plVar4 + 2;
    if ((long *)*plVar4 == plVar9) {
      local_218 = *plVar9;
      lStack_210 = plVar4[3];
    }
    else {
      local_218 = *plVar9;
      local_228 = (long *)*plVar4;
    }
    local_220 = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_228,(ulong)local_248._M_dataplus._M_p);
    local_208 = &local_1f8;
    plVar9 = plVar4 + 2;
    if ((long *)*plVar4 == plVar9) {
      local_1f8 = *plVar9;
      lStack_1f0 = plVar4[3];
    }
    else {
      local_1f8 = *plVar9;
      local_208 = (long *)*plVar4;
    }
    local_200 = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_320 = *puVar8;
      lStack_318 = plVar4[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar8;
      local_330 = (ulong *)*plVar4;
    }
    local_328 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>((double)local_30c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar10 = 0xf;
    if (local_330 != &local_320) {
      uVar10 = local_320;
    }
    if (uVar10 < (ulong)(local_280 + local_328)) {
      uVar10 = 0xf;
      if (local_288 != local_278) {
        uVar10 = local_278[0];
      }
      if (uVar10 < (ulong)(local_280 + local_328)) goto LAB_0103847b;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_0103847b:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_288);
    }
    local_350 = &local_340;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_340 = *plVar4;
      uStack_338 = puVar5[3];
    }
    else {
      local_340 = *plVar4;
      local_350 = (long *)*puVar5;
    }
    local_348 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1e8.field_2._M_allocated_capacity = *psVar1;
    local_1e8.field_2._8_8_ = puVar5[3];
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar1;
    local_1e8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1e8._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (optimized) {
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_268 != local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    local_258[0] = local_2b8;
    local_268 = local_2c8;
    if (local_2c8 == &local_2b8) goto LAB_01038a1e;
  }
  else {
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_268 == local_258) goto LAB_01038a1e;
  }
  operator_delete(local_268,local_258[0] + 1);
LAB_01038a1e:
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_local_buf[0] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     local_1a8,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT17(local_248.field_2._M_local_buf[7],
                             CONCAT25(local_248.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_248.field_2._M_local_buf[4],
                                               local_248.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		float scale = 0.0f;
		for (int i = 0; i < m_numLoopIterations; i++)
			scale += 3.2f*(float)i + 4.6f;
		scale = 1.0f / scale;

		const string precision		= getShaderPrecision(m_caseShaderType);
		const string statements		= optimized ?	"	" + precision + " vec4 valueOrig = value;\n"
													"	" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n"

												:	"	" + precision + " vec4 valueOrig = value;\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n";

		return defaultProgramData(m_caseShaderType, statements);
	}